

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

Labeldesc * findlabel(LexState *ls,TString *name,int ilb)

{
  Labeldesc *pLVar1;
  Labeldesc *lb;
  Dyndata *dyd;
  int ilb_local;
  TString *name_local;
  LexState *ls_local;
  
  dyd._4_4_ = ilb;
  while( true ) {
    if ((ls->dyd->label).n <= dyd._4_4_) {
      return (Labeldesc *)0x0;
    }
    pLVar1 = (ls->dyd->label).arr + dyd._4_4_;
    if (pLVar1->name == name) break;
    dyd._4_4_ = dyd._4_4_ + 1;
  }
  return pLVar1;
}

Assistant:

static Labeldesc *findlabel (LexState *ls, TString *name, int ilb) {
  Dyndata *dyd = ls->dyd;
  for (; ilb < dyd->label.n; ilb++) {
    Labeldesc *lb = &dyd->label.arr[ilb];
    if (eqstr(lb->name, name))  /* correct label? */
      return lb;
  }
  return NULL;  /* label not found */
}